

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O3

void __thiscall
cmCursesCacheEntryComposite::~cmCursesCacheEntryComposite(cmCursesCacheEntryComposite *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCursesWidget *pcVar3;
  cmCursesLabelWidget *pcVar4;
  _Head_base<0UL,_cmCursesLabelWidget_*,_false> _Var5;
  pointer *__ptr;
  
  pcVar2 = (this->Key)._M_dataplus._M_p;
  paVar1 = &(this->Key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->Entry)._M_t.
           super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
           super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
           super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl;
  if (pcVar3 != (cmCursesWidget *)0x0) {
    (*pcVar3->_vptr_cmCursesWidget[1])();
  }
  (this->Entry)._M_t.super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
  _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = (cmCursesWidget *)0x0;
  pcVar4 = (this->IsNewLabel)._M_t.
           super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
           super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  if (pcVar4 != (cmCursesLabelWidget *)0x0) {
    (**(code **)((long)(pcVar4->super_cmCursesWidget)._vptr_cmCursesWidget + 8))();
  }
  (this->IsNewLabel)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  _Var5._M_head_impl =
       (this->Label)._M_t.
       super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
       super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
       super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  if (_Var5._M_head_impl != (cmCursesLabelWidget *)0x0) {
    (**(code **)(*(long *)&(_Var5._M_head_impl)->super_cmCursesWidget + 8))();
  }
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  return;
}

Assistant:

cmCursesCacheEntryComposite::~cmCursesCacheEntryComposite() = default;